

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumValueOptions::MergeFrom(EnumValueOptions *this,EnumValueOptions *from)

{
  LogMessage *other;
  UnknownFieldSet *this_00;
  UnknownFieldSet *other_00;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  EnumValueOptions *local_18;
  EnumValueOptions *from_local;
  EnumValueOptions *this_local;
  
  local_51 = 0;
  local_18 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1880);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  RepeatedPtrField<google::protobuf::UninterpretedOption>::MergeFrom
            (&this->uninterpreted_option_,&local_18->uninterpreted_option_);
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&local_18->_extensions_);
  this_00 = mutable_unknown_fields(this);
  other_00 = unknown_fields(local_18);
  UnknownFieldSet::MergeFrom(this_00,other_00);
  return;
}

Assistant:

void EnumValueOptions::MergeFrom(const EnumValueOptions& from) {
  GOOGLE_CHECK_NE(&from, this);
  uninterpreted_option_.MergeFrom(from.uninterpreted_option_);
  _extensions_.MergeFrom(from._extensions_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}